

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O0

result<toml::basic_value<toml::type_config>,_std::vector<toml::error_info,_std::allocator<toml::error_info>_>_>
* toml::try_parse<toml::type_config>(istream *is,string *fname,spec s)

{
  undefined8 uVar1;
  undefined8 uVar2;
  uchar *puVar3;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_RDX;
  char *in_RSI;
  result<toml::basic_value<toml::type_config>,_std::vector<toml::error_info,_std::allocator<toml::error_info>_>_>
  *in_RDI;
  vector<unsigned_char,_std::allocator<unsigned_char>_> letters;
  streamoff fsize;
  pos_type end;
  pos_type beg;
  spec *in_stack_00000388;
  string *in_stack_00000390;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_00000398;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_ffffffffffffff00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  allocator_type *in_stack_ffffffffffffff08;
  result<toml::basic_value<toml::type_config>,_std::vector<toml::error_info,_std::allocator<toml::error_info>_>_>
  *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__str;
  _Alloc_hider in_stack_ffffffffffffff40;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_a0;
  undefined1 local_72 [34];
  undefined4 uStack_50;
  undefined4 uStack_4c;
  streamoff local_40;
  fpos<__mbstate_t> local_38;
  undefined1 local_28 [16];
  char *local_10;
  
  this_00 = in_RDI;
  local_10 = in_RSI;
  local_28 = std::istream::tellg();
  std::istream::seekg((long)local_10,_S_beg);
  local_38 = (fpos<__mbstate_t>)std::istream::tellg();
  local_40 = std::fpos<__mbstate_t>::operator-(&local_38,(fpos<__mbstate_t> *)local_28);
  uVar2 = local_28._8_8_;
  uVar1 = local_28._0_8_;
  local_72._26_4_ = local_28._0_4_;
  local_72._30_4_ = local_28._4_4_;
  uStack_50 = local_28._8_4_;
  uStack_4c = local_28._12_4_;
  std::istream::seekg(local_10,uVar1,uVar2);
  local_72[1] = 0;
  __str = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_72;
  CLI::std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)0x646b8f);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this_00,(size_type)in_RDI,
             (value_type_conflict *)in_RDX,in_stack_ffffffffffffff08);
  CLI::std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)local_72);
  puVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x646bd7);
  std::istream::read(local_10,(long)puVar3);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (in_stack_ffffffffffffff00,&local_a0);
  this = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         &stack0xffffffffffffff40;
  std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffff40._M_p,__str);
  detail::parse_impl<toml::type_config>(in_stack_00000398,in_stack_00000390,in_stack_00000388);
  std::__cxx11::string::~string(this);
  CLI::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(in_RDX);
  CLI::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(in_RDX);
  return this_00;
}

Assistant:

result<basic_value<TC>, std::vector<error_info>>
try_parse(std::istream& is, std::string fname = "unknown file", spec s = spec::default_version())
{
    const auto beg = is.tellg();
    is.seekg(0, std::ios::end);
    const auto end = is.tellg();
    const auto fsize = end - beg;
    is.seekg(beg);

    // read whole file as a sequence of char
    assert(fsize >= 0);
    std::vector<detail::location::char_type> letters(static_cast<std::size_t>(fsize), '\0');
    is.read(reinterpret_cast<char*>(letters.data()), static_cast<std::streamsize>(fsize));

    return detail::parse_impl<TC>(std::move(letters), std::move(fname), std::move(s));
}